

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O1

exr_result_t
exr_attr_set_chromaticities
          (exr_context_t ctxt,int part_index,char *name,exr_attr_chromaticities_t *val)

{
  exr_attr_m33d_t *peVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  exr_result_t eVar5;
  int iVar6;
  code *UNRECOVERED_JUMPTABLE;
  char *pcVar7;
  undefined8 uVar8;
  char *pcVar9;
  exr_attribute_list_t *list;
  exr_attribute_t *attr;
  exr_attribute_t *local_30;
  
  local_30 = (exr_attribute_t *)0x0;
  if (ctxt == (exr_context_t)0x0) {
    return 2;
  }
  if ((part_index < 0) || (*(int *)(ctxt + 0xc4) <= part_index)) {
    eVar5 = (**(code **)(ctxt + 0x48))
                      (ctxt,4,"Part index (%d) out of range",part_index,*(code **)(ctxt + 0x48));
    return eVar5;
  }
  if (*ctxt == (_priv_exr_context_t)0x3) {
    UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x38);
    uVar8 = 0x15;
LAB_00119088:
    eVar5 = (*UNRECOVERED_JUMPTABLE)(ctxt,uVar8);
    return eVar5;
  }
  if (*ctxt == (_priv_exr_context_t)0x0) {
    UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x38);
    uVar8 = 8;
    goto LAB_00119088;
  }
  list = (exr_attribute_list_t *)
         (*(long *)(*(long *)(ctxt + 0x1d8) + (ulong)(uint)part_index * 8) + 8);
  eVar5 = exr_attr_list_find_by_name(ctxt,list,name,&local_30);
  if (eVar5 == 0) {
    iVar6 = 0;
    if (local_30->type != EXR_ATTR_CHROMATICITIES) {
      pcVar9 = local_30->type_name;
      pcVar7 = "\'%s\' requested type \'chromaticities\', but stored attributes is type \'%s\'";
      uVar8 = 0x10;
      goto LAB_00119153;
    }
  }
  else {
    if (eVar5 != 0xf) {
      return eVar5;
    }
    if (*ctxt != (_priv_exr_context_t)0x1) {
      return 0xf;
    }
    iVar6 = exr_attr_list_add(ctxt,list,name,EXR_ATTR_CHROMATICITIES,0,(uint8_t **)0x0,&local_30);
  }
  if (val != (exr_attr_chromaticities_t *)0x0) {
    if (iVar6 != 0) {
      return iVar6;
    }
    peVar1 = (local_30->field_6).m33d;
    dVar2 = *(double *)val;
    dVar3 = *(double *)&val->green_x;
    dVar4 = *(double *)&val->white_x;
    peVar1->m[2] = *(double *)&val->blue_x;
    peVar1->m[3] = dVar4;
    peVar1->m[0] = dVar2;
    peVar1->m[1] = dVar3;
    return 0;
  }
  pcVar7 = "No input value for setting \'%s\', type \'%s\'";
  pcVar9 = "chromaticities";
  uVar8 = 3;
LAB_00119153:
  eVar5 = (**(code **)(ctxt + 0x48))(ctxt,uVar8,pcVar7,name,pcVar9);
  return eVar5;
}

Assistant:

exr_result_t
exr_attr_set_chromaticities (
    exr_context_t                    ctxt,
    int                              part_index,
    const char*                      name,
    const exr_attr_chromaticities_t* val)
{
    ATTR_SET_IMPL_DEREF (EXR_ATTR_CHROMATICITIES, chromaticities);
}